

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PackedArray_my_test.cpp
# Opt level: O0

void __thiscall PackedArray_Random_Test::PackedArray_Random_Test(PackedArray_Random_Test *this)

{
  PackedArray_Random_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__PackedArray_Random_Test_00176c40;
  return;
}

Assistant:

TEST(PackedArray, Random)
{
    offs.reserve(tot);
    val.reserve(tot);

    std::random_device rd;     //Get a random seed from the OS entropy device, or whatever
    std::mt19937_64 eng(rd());
    std::uniform_int_distribution<uint32_t> distr;

    for (int a = 0; a < els; a++) {
        val.push_back(distr(eng));
        offs.push_back(distr(eng) & (els-1));
    }
    TestSetGet<16>::test();
    TestSetGet<17>::test();
    TestSetGet<18>::test();
    TestSetGet<19>::test();
    TestSetGet<20>::test();
    TestSetGet<21>::test();
    TestSetGet<22>::test();
//    TestOrSpeed<16>::test();
//    TestOrSpeed<17>::test();
//    TestOrSpeed<18>::test();
//    TestOrSpeed<19>::test();
//    TestOrSpeed<20>::test();
//    TestOrSpeed<21>::test();
//    TestOrSpeed<22>::test();

}